

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

bool __thiscall
dap::BasicTypeInfo<std::vector<dap::integer,_std::allocator<dap::integer>_>_>::deserialize
          (BasicTypeInfo<std::vector<dap::integer,_std::allocator<dap::integer>_>_> *this,
          Deserializer *d,void *ptr)

{
  bool bVar1;
  void *ptr_local;
  Deserializer *d_local;
  BasicTypeInfo<std::vector<dap::integer,_std::allocator<dap::integer>_>_> *this_local;
  
  bVar1 = Deserializer::deserialize<dap::integer>(d,(array<dap::integer> *)ptr);
  return bVar1;
}

Assistant:

inline bool deserialize(const Deserializer* d, void* ptr) const override {
    return d->deserialize(reinterpret_cast<T*>(ptr));
  }